

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  byte bVar1;
  uint uVar2;
  LogMessage *other;
  ServiceOptions *this_00;
  ServiceOptions *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0xf3e);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
            (&(this->method_).super_RepeatedPtrFieldBase,&(from->method_).super_RepeatedPtrFieldBase
            );
  bVar1 = (byte)from->_has_bits_[0];
  uVar2 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      set_name(this,from->name_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (ServiceOptions *)0x0) {
        from_00 = *(ServiceOptions **)(default_instance_ + 0x30);
      }
      ServiceOptions::MergeFrom(this_00,from_00);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  method_.MergeFrom(from.method_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::ServiceOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}